

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blurayHelper.cpp
# Opt level: O2

int __thiscall BlurayHelper::open(BlurayHelper *this,char *__file,int __oflag,...)

{
  string *src;
  bool bVar1;
  char delimiter;
  int iVar2;
  IsoWriter *this_00;
  int in_ECX;
  uint in_R8D;
  char in_R9B;
  string fileExt;
  IsoHeaderData local_c0;
  string local_70;
  string local_50;
  
  toNativeSeparators(&local_c0.appId,(string *)__file);
  src = &this->m_dstPath;
  std::__cxx11::string::operator=((string *)src,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  this->m_dt = __oflag;
  extractFileExt(&local_50,src);
  strToUpperCase(&local_70,&local_50);
  unquoteStr(&local_c0.appId,&local_70);
  std::__cxx11::string::operator=((string *)&local_50,(string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_c0);
  std::__cxx11::string::~string((string *)&local_70);
  bVar1 = std::operator==(&local_50,"ISO");
  if (bVar1) {
    this_00 = (IsoWriter *)operator_new(0x930);
    if (in_R9B == '\0') {
      IsoHeaderData::normal();
    }
    else {
      IsoHeaderData::reproducible();
    }
    IsoWriter::IsoWriter(this_00,&local_c0);
    this->m_isoWriter = this_00;
    IsoHeaderData::~IsoHeaderData(&local_c0);
    IsoWriter::setLayerBreakPoint(this->m_isoWriter,0xba7200);
    iVar2 = IsoWriter::open(this->m_isoWriter,(char *)src,in_ECX,(ulong)in_R8D);
  }
  else {
    delimiter = getDirSeparator();
    closeDirPath(&local_c0.appId,src,delimiter);
    std::__cxx11::string::operator=((string *)src,(string *)&local_c0);
    std::__cxx11::string::~string((string *)&local_c0);
    iVar2 = (int)CONCAT71((int7)((ulong)src >> 8),1);
  }
  std::__cxx11::string::~string((string *)&local_50);
  return iVar2;
}

Assistant:

bool BlurayHelper::open(const string& dst, const DiskType dt, const int64_t diskSize, const int extraISOBlocks,
                        const bool useReproducibleIsoHeader)
{
    m_dstPath = toNativeSeparators(dst);

    m_dt = dt;
    string fileExt = extractFileExt(m_dstPath);
    fileExt = unquoteStr(strToUpperCase(fileExt));
    if (fileExt == "ISO")
    {
        m_isoWriter = new IsoWriter(useReproducibleIsoHeader ? IsoHeaderData::reproducible() : IsoHeaderData::normal());
        m_isoWriter->setLayerBreakPoint(0xBA7200);  // around 25Gb
        return m_isoWriter->open(m_dstPath, diskSize, extraISOBlocks);
    }
    m_dstPath = closeDirPath(m_dstPath, getDirSeparator());
    return true;
}